

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_cosine_transform.h
# Opt level: O2

void __thiscall sptk::DiscreteCosineTransform::Buffer::~Buffer(Buffer *this)

{
  ~Buffer(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Buffer() {
    }